

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O0

char * HPDF_StrStr(char *s1,char *s2,HPDF_UINT maxlen)

{
  HPDF_UINT n;
  HPDF_INT HVar1;
  uint local_24;
  HPDF_UINT len;
  HPDF_UINT maxlen_local;
  char *s2_local;
  char *s1_local;
  
  n = HPDF_StrLen(s2,-1);
  if (s1 == (char *)0x0) {
    s1_local = (char *)0x0;
  }
  else {
    s1_local = s1;
    if (n != 0) {
      local_24 = maxlen;
      if (maxlen == 0) {
        local_24 = HPDF_StrLen(s1,-1);
      }
      if (local_24 < n) {
        s1_local = (char *)0x0;
      }
      else {
        s2_local = s1;
        for (local_24 = (local_24 - n) + 1; local_24 != 0; local_24 = local_24 + -1) {
          HVar1 = HPDF_MemCmp((HPDF_BYTE *)s2_local,(HPDF_BYTE *)s2,n);
          if (HVar1 == 0) {
            return s2_local;
          }
          s2_local = s2_local + 1;
        }
        s1_local = (char *)0x0;
      }
    }
  }
  return s1_local;
}

Assistant:

const char*
HPDF_StrStr  (const char   *s1,
              const char   *s2,
              HPDF_UINT     maxlen)
{
    HPDF_UINT len = HPDF_StrLen (s2, -1);

    if (!s1)
        return NULL;

    if (len == 0)
        return s1;

    if (maxlen == 0)
        maxlen = HPDF_StrLen (s1, -1);

    if (maxlen < len)
        return NULL;

    maxlen -= len;
    maxlen++;

    while (maxlen > 0) {
        if (HPDF_MemCmp ((HPDF_BYTE *)s1, (HPDF_BYTE *)s2, len) == 0)
            return s1;

        s1++;
        maxlen--;
    }

    return NULL;
}